

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall libcellml::Units::addUnit(Units *this,StandardUnit standardUnit)

{
  mapped_type *reference;
  allocator<char> local_56;
  allocator<char> local_55;
  StandardUnit local_54;
  string local_50;
  string local_30;
  
  local_54 = standardUnit;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&local_54);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"0",&local_55);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_56);
  addUnit(this,reference,&local_30,1.0,1.0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit)
{
    addUnit(standardUnitToString.at(standardUnit), "0", 1.0, 1.0, "");
}